

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O1

void mquaffmsg(monst *mtmp,obj *otmp)

{
  uint uVar1;
  boolean bVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) &&
       (((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
        (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0 || ((mtmp->data->mflags3 & 0x200) == 0))))))
    goto LAB_001f975d;
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 == '\0') goto LAB_001f975d;
  }
  uVar1 = *(uint *)&mtmp->field_0x60;
  if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar1 & 0x280) != 0) goto LAB_001f975d;
  }
  else if (((uVar1 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_001f975d;
  if ((u._1052_1_ & 0x20) == 0) {
    otmp->field_0x4a = otmp->field_0x4a | 0x20;
    pcVar3 = Monnam(mtmp);
    pcVar4 = singular(otmp,doname);
    pline("%s drinks %s!",pcVar3,pcVar4);
    return;
  }
LAB_001f975d:
  if (flags.soundok == '\0') {
    return;
  }
  You_hear("a chugging sound.");
  return;
}

Assistant:

static void mquaffmsg(struct monst *mtmp, struct obj *otmp)
{
	if (canseemon(level, mtmp)) {
		otmp->dknown = 1;
		pline("%s drinks %s!", Monnam(mtmp), singular(otmp, doname));
	} else
		if (flags.soundok)
			You_hear("a chugging sound.");
}